

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseAttachBoxes(Ver_Man_t *pMan)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  void *pvVar3;
  int local_44;
  int nMaxBoxSize;
  int Counter;
  int RetValue;
  int i;
  Vec_Ptr_t *vUndefs;
  Ver_Bundle_t *pBundle;
  Abc_Ntk_t *pNtk;
  int fPrintLog;
  Ver_Man_t *pMan_local;
  
  pBundle = (Ver_Bundle_t *)0x0;
  pMan_local._4_4_ = Ver_ParseConnectDefBoxes(pMan);
  if (1 < pMan_local._4_4_) {
    Ver_ParseReportUndefBoxes(pMan);
    p = Ver_ParseCollectUndefBoxes(pMan);
    iVar1 = Vec_PtrSize(p);
    if (iVar1 < 1) {
      __assert_fail("Vec_PtrSize( vUndefs ) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                    ,0xb4c,"int Ver_ParseAttachBoxes(Ver_Man_t *)");
    }
    local_44 = 0;
    iVar1 = Ver_ParseMaxBoxSize(p);
LAB_0037a354:
    do {
      iVar2 = Ver_ParseCheckNondrivenNets(p);
      if (iVar2 == 0 || iVar1 <= local_44) {
        iVar1 = Ver_ParseDriveInputs(pMan,p);
        if (iVar1 == 0) {
          return 0;
        }
        for (Counter = 0; iVar1 = Vec_PtrSize(p), Counter < iVar1; Counter = Counter + 1) {
          pvVar3 = Vec_PtrEntry(p,Counter);
          Vec_PtrFree(*(Vec_Ptr_t **)((long)pvVar3 + 0x158));
          *(undefined8 *)((long)pvVar3 + 0x158) = 0;
        }
        Vec_PtrFree(p);
        return 1;
      }
      vUndefs = (Vec_Ptr_t *)0x0;
      for (Counter = 0; iVar2 = Vec_PtrSize(p), Counter < iVar2; Counter = Counter + 1) {
        pBundle = (Ver_Bundle_t *)Vec_PtrEntry(p,Counter);
        vUndefs = (Vec_Ptr_t *)Ver_ParseGetNondrivenBundle((Abc_Ntk_t *)pBundle,local_44);
        if (vUndefs != (Vec_Ptr_t *)0x0) break;
      }
      if (vUndefs == (Vec_Ptr_t *)0x0) {
        local_44 = local_44 + 1;
        goto LAB_0037a354;
      }
      iVar2 = Ver_ParseDriveFormal(pMan,(Abc_Ntk_t *)pBundle,(Ver_Bundle_t *)vUndefs);
    } while (iVar2 != 0);
    pMan_local._4_4_ = 0;
  }
  return pMan_local._4_4_;
}

Assistant:

int Ver_ParseAttachBoxes( Ver_Man_t * pMan )
{
    int fPrintLog = 0;
    Abc_Ntk_t * pNtk = NULL;
    Ver_Bundle_t * pBundle;
    Vec_Ptr_t * vUndefs;
    int i, RetValue, Counter, nMaxBoxSize;

    // print the log file
    if ( fPrintLog && pMan->pDesign->vModules && Vec_PtrSize(pMan->pDesign->vModules) > 1 )
        Ver_ParsePrintLog( pMan );

    // connect defined boxes
    RetValue = Ver_ParseConnectDefBoxes( pMan );
    if ( RetValue < 2 )
        return RetValue;

    // report the boxes
    Ver_ParseReportUndefBoxes( pMan );

    // collect undef box types and their actual instances
    vUndefs = Ver_ParseCollectUndefBoxes( pMan );
    assert( Vec_PtrSize( vUndefs ) > 0 );

    // go through all undef box types
    Counter = 0;
    nMaxBoxSize = Ver_ParseMaxBoxSize( vUndefs );
    while ( Ver_ParseCheckNondrivenNets(vUndefs) && Counter < nMaxBoxSize )
    {
        // go through undef box types
        pBundle = NULL;
        Vec_PtrForEachEntry( Abc_Ntk_t *, vUndefs, pNtk, i )
            if ( (pBundle = Ver_ParseGetNondrivenBundle( pNtk, Counter )) )
                break;
        if ( pBundle == NULL )
        {
            Counter++;
            continue;
        }
        // drive this bundle by this box
        if ( !Ver_ParseDriveFormal( pMan, pNtk, pBundle ) )
            return 0;
    }

    // make all the remaining bundles the drivers of undefs
    if ( !Ver_ParseDriveInputs( pMan, vUndefs ) )
        return 0;

    // cleanup
    Vec_PtrForEachEntry( Abc_Ntk_t *, vUndefs, pNtk, i )
    {
        Vec_PtrFree( (Vec_Ptr_t *)pNtk->pData );
        pNtk->pData = NULL;
    }
    Vec_PtrFree( vUndefs ); 
    return 1;
}